

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc_cord_state.h
# Opt level: O1

crc32c_t __thiscall absl::lts_20250127::crc_internal::CrcCordState::Checksum(CrcCordState *this)

{
  RefcountedRep *pRVar1;
  size_t sVar2;
  _Elt_pointer pPVar3;
  crc32c_t cVar4;
  _Elt_pointer pPVar5;
  _Elt_pointer pPVar6;
  
  pRVar1 = this->refcounted_rep_;
  pPVar5 = (pRVar1->rep).prefix_crc.
           super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pPVar5 == (pRVar1->rep).prefix_crc.
                super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    return (crc32c_t)0;
  }
  sVar2 = (pRVar1->rep).removed_prefix.length;
  if (sVar2 != 0) {
    pPVar3 = (pRVar1->rep).prefix_crc.
             super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first;
    pPVar6 = pPVar5;
    if (pPVar5 == pPVar3) {
      pPVar6 = (pRVar1->rep).prefix_crc.
               super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    if (pPVar5 == pPVar3) {
      pPVar5 = (pRVar1->rep).prefix_crc.
               super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    cVar4 = RemoveCrc32cPrefix((pRVar1->rep).removed_prefix.crc.crc_,pPVar6[-1].crc.crc_,
                               pPVar5[-1].length - sVar2);
    return (crc32c_t)cVar4.crc_;
  }
  if (pPVar5 == (pRVar1->rep).prefix_crc.
                super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pPVar5 = (pRVar1->rep).prefix_crc.
             super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
  }
  return (crc32c_t)pPVar5[-1].crc.crc_;
}

Assistant:

const Rep& rep() const { return refcounted_rep_->rep; }